

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O1

int cram_huffman_encode_int(cram_slice *slice,cram_codec *c,char *in,int in_size)

{
  cram_encoding cVar1;
  bool bVar2;
  uint uVar3;
  cram_encoding *pcVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  cram_codec *pcVar8;
  
  uVar7 = 0;
  do {
    cVar1 = *(cram_encoding *)in;
    if (cVar1 + E_EXTERNAL < 0x81) {
      lVar5 = (long)*(int *)((long)&c->field_6 + (ulong)(cVar1 + E_EXTERNAL) * 4 + 0xc);
      pcVar8 = (c->field_6).byte_array_len.len_codec;
      if ((&pcVar8->codec)[lVar5 * 4] != cVar1) {
        __assert_fail("c->e_huffman.codes[i].symbol == sym",
                      "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/cram_codecs.c"
                      ,0x45c,"int cram_huffman_encode_int(cram_slice *, cram_codec *, char *, int)")
        ;
      }
      pcVar4 = &pcVar8->codec + lVar5 * 4;
LAB_00153c7e:
      uVar3 = store_bits_MSB(c->out,pcVar4[2],pcVar4[3]);
      uVar7 = uVar7 | uVar3;
      bVar2 = true;
    }
    else {
      uVar3 = (c->field_6).e_huffman.nvals;
      if ((int)uVar3 < 1) {
        uVar6 = 0;
      }
      else {
        pcVar8 = (c->field_6).byte_array_len.len_codec;
        uVar6 = 0;
        do {
          if (pcVar8->codec == cVar1) goto LAB_00153c6c;
          uVar6 = uVar6 + 1;
          pcVar8 = (cram_codec *)&pcVar8->free;
        } while (uVar3 != uVar6);
        uVar6 = (ulong)uVar3;
      }
LAB_00153c6c:
      if ((uint)uVar6 != uVar3) {
        pcVar4 = &((c->field_6).byte_array_len.len_codec)->codec + (uVar6 & 0xffffffff) * 4;
        goto LAB_00153c7e;
      }
      bVar2 = false;
    }
    if (!bVar2) {
      return -1;
    }
    in = (char *)((long)in + 4);
    in_size = in_size + -1;
    if (in_size == 0) {
      return uVar7;
    }
  } while( true );
}

Assistant:

int cram_huffman_encode_int(cram_slice *slice, cram_codec *c,
			    char *in, int in_size) {
    int i, code, len, r = 0;
    int *syms = (int *)in;

    do {
	int sym = *syms++;

	if (sym >= -1 && sym < MAX_HUFF) {
	    i = c->e_huffman.val2code[sym+1];
	    assert(c->e_huffman.codes[i].symbol == sym);
	    code = c->e_huffman.codes[i].code;
	    len  = c->e_huffman.codes[i].len;
	} else {
	    /* Slow - use a lookup table for when sym < MAX_HUFFMAN_SYM? */
	    for (i = 0; i < c->e_huffman.nvals; i++) {
		if (c->e_huffman.codes[i].symbol == sym)
		    break;
	    }
	    if (i == c->e_huffman.nvals)
		return -1;
    
	    code = c->e_huffman.codes[i].code;
	    len  = c->e_huffman.codes[i].len;
	}

	r |= store_bits_MSB(c->out, code, len);
    } while (--in_size);

    return r;
}